

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_declare(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  char *__s1;
  int iVar1;
  _canvasenvironment *e_00;
  t_symbol *ptVar2;
  char *local_50;
  char *item;
  char *flag;
  _canvasenvironment *e;
  int i;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  _glist *x_local;
  
  e_00 = canvas_getenv(x);
  for (e._4_4_ = 0; e._4_4_ < argc; e._4_4_ = e._4_4_ + 1) {
    ptVar2 = atom_getsymbolarg(e._4_4_,argc,argv);
    __s1 = ptVar2->s_name;
    if (e._4_4_ + 1 < argc) {
      ptVar2 = atom_getsymbolarg(e._4_4_ + 1,argc,argv);
      local_50 = ptVar2->s_name;
    }
    else {
      local_50 = (char *)0x0;
    }
    if ((local_50 == (char *)0x0) || (iVar1 = strcmp(__s1,"-path"), iVar1 != 0)) {
      if ((local_50 == (char *)0x0) || (iVar1 = strcmp(__s1,"-stdpath"), iVar1 != 0)) {
        if ((local_50 == (char *)0x0) || (iVar1 = strcmp(__s1,"-lib"), iVar1 != 0)) {
          if ((local_50 == (char *)0x0) || (iVar1 = strcmp(__s1,"-stdlib"), iVar1 != 0)) {
            post("declare: %s: unknown declaration",__s1);
          }
          else {
            canvas_stdlib(e_00,local_50);
            e._4_4_ = e._4_4_ + 1;
          }
        }
        else {
          canvas_lib(x,e_00,local_50);
          e._4_4_ = e._4_4_ + 1;
        }
      }
      else {
        canvas_stdpath(e_00,local_50);
        e._4_4_ = e._4_4_ + 1;
      }
    }
    else {
      canvas_path(x,e_00,local_50);
      e._4_4_ = e._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void canvas_declare(t_canvas *x, t_symbol *s, int argc, t_atom *argv)
{
    int i;
    t_canvasenvironment *e = canvas_getenv(x);
#if 0
    startpost("declare:: %s", s->s_name);
    postatom(argc, argv);
    endpost();
#endif
    for (i = 0; i < argc; i++)
    {
        const char *flag = atom_getsymbolarg(i, argc, argv)->s_name;
        const char *item = (argc > i+1)?atom_getsymbolarg(i+1, argc, argv)->s_name:0;
        if ((item) && !strcmp(flag, "-path"))
        {
            canvas_path(x, e, item);
            i++;
        }
        else if ((item) && !strcmp(flag, "-stdpath"))
        {
            canvas_stdpath(e, item);
            i++;
        }
        else if ((item) && !strcmp(flag, "-lib"))
        {
            canvas_lib(x, e, item);
            i++;
        }
        else if ((item) && !strcmp(flag, "-stdlib"))
        {
            canvas_stdlib(e, item);
            i++;
        }
        else post("declare: %s: unknown declaration", flag);
    }
}